

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

void __thiscall cursespp::Window::Destroy(Window *this)

{
  if (this->frame != (WINDOW *)0x0) {
    del_panel(this->framePanel);
    delwin(this->frame);
    if (this->content != this->frame) {
      del_panel(this->contentPanel);
      delwin(this->content);
    }
  }
  this->contentPanel = (PANEL *)0x0;
  this->content = (WINDOW *)0x0;
  this->framePanel = (PANEL *)0x0;
  this->frame = (WINDOW *)0x0;
  this->isDirty = true;
  NotifyVisibilityChange(this,false);
  return;
}

Assistant:

void Window::Destroy() {
    ASSERT_MAIN_THREAD();

    if (this->frame) {
        del_panel(this->framePanel);
        delwin(this->frame);

        if (this->content != this->frame) {
            del_panel(this->contentPanel);
            delwin(this->content);
        }
    }

    this->framePanel = this->contentPanel = 0;
    this->content = this->frame = 0;
    this->isDirty = true;

    this->NotifyVisibilityChange(false);
}